

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

void JSON::writeClose(Pipeline *p,bool first,size_t depth,char *delimiter)

{
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string s;
  
  if ((int)CONCAT71(in_register_00000031,first) != 0) {
    Pipeline::operator<<(p,delimiter);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"\n",(allocator<char> *)&local_60)
  ;
  std::__cxx11::string::append((ulong)&s,(char)depth * '\x02');
  std::operator+(&local_60,&s,delimiter);
  Pipeline::operator<<(p,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void
JSON::writeClose(Pipeline* p, bool first, size_t depth, char const* delimiter)
{
    if (first) {
        *p << delimiter;
    } else {
        std::string s{"\n"};
        s.append(2 * depth, ' ');
        *p << s + delimiter;
    }
}